

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall
duckdb_parquet::EncryptionWithColumnKey::printTo(EncryptionWithColumnKey *this,ostream *out)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_00;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"EncryptionWithColumnKey(",0x18);
  std::__ostream_insert<char,std::char_traits<char>>(out,"path_in_schema=",0xf);
  duckdb_apache::thrift::to_string<std::__cxx11::string>
            (&local_40,(thrift *)&this->path_in_schema,t);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"key_metadata=",0xd);
  if (((byte)this->__isset & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<std::__cxx11::string>
              (&local_40,(thrift *)&this->key_metadata,t_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_40._M_dataplus._M_p,local_40._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void EncryptionWithColumnKey::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "EncryptionWithColumnKey(";
  out << "path_in_schema=" << to_string(path_in_schema);
  out << ", " << "key_metadata="; (__isset.key_metadata ? (out << to_string(key_metadata)) : (out << "<null>"));
  out << ")";
}